

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

ON_Curve * __thiscall ON_Extrusion::Profile3d(ON_Extrusion *this,ON_COMPONENT_INDEX ci)

{
  ON_Curve *pOVar1;
  double s;
  
  if (ci.m_type == extrusion_bottom_profile) {
    s = 0.0;
  }
  else {
    if (ci.m_type != extrusion_top_profile) {
      return (ON_Curve *)0x0;
    }
    s = 1.0;
  }
  pOVar1 = Profile3d(this,ci.m_index,s);
  return pOVar1;
}

Assistant:

ON_Curve* ON_Extrusion::Profile3d( ON_COMPONENT_INDEX ci ) const
{
  double s = ON_UNSET_VALUE;
  if ( ON_COMPONENT_INDEX::extrusion_bottom_profile == ci.m_type )
    s = 0.0;
  else if ( ON_COMPONENT_INDEX::extrusion_top_profile == ci.m_type )
    s = 1.0;
  else
    return 0;
  return Profile3d(ci.m_index,s);
}